

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  RegularExpression *pRVar1;
  pointer pRVar2;
  bool bVar3;
  bool bVar4;
  RegularExpression *regex;
  RegularExpression *this_00;
  pointer this_01;
  RegularExpressionMatch match;
  RegularExpressionMatch local_d8;
  
  local_d8.startp[0] = (char *)0x0;
  local_d8.endp[0] = (char *)0x0;
  local_d8.searchstring = (char *)0x0;
  pRVar1 = (this->PreIncludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->PreIncludeRegexes).
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1; this_00 = this_00 + 1
      ) {
    bVar3 = cmsys::RegularExpression::find(this_00,(name->_M_dataplus)._M_p,&local_d8);
    if (bVar3) {
      return false;
    }
  }
  this_01 = (this->PreExcludeRegexes).
            super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->PreExcludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pRVar2) {
    bVar3 = false;
    do {
      bVar4 = cmsys::RegularExpression::find(this_01,(name->_M_dataplus)._M_p,&local_d8);
      bVar3 = (bool)(bVar3 | bVar4);
      if (bVar4) {
        return bVar3;
      }
      this_01 = this_01 + 1;
    } while (this_01 != pRVar2);
  }
  return false;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name)
{
  cmsys::RegularExpressionMatch match;

  for (auto const& regex : this->PreIncludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return false;
    }
  }

  for (auto const& regex : this->PreExcludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return true;
    }
  }

  return false;
}